

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O1

gs_expr_t * gs_parse_expr_assignment(gs_parser_t *parser)

{
  int iVar1;
  gs_token_t *pgVar2;
  anon_union_8_5_f029217d_for_gs_token_3 aVar3;
  gs_token_type gVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  gs_expr_t *pgVar8;
  gs_expr_t *pgVar9;
  gs_expr_t *pgVar10;
  bool bVar11;
  bool bVar12;
  gs_token_t token;
  
  pgVar2 = (parser->tokens).data;
  aVar3 = pgVar2[parser->cur_token].field_3;
  pgVar2 = pgVar2 + parser->cur_token;
  gVar4 = pgVar2->type;
  iVar5 = pgVar2->line;
  iVar6 = pgVar2->col;
  uVar7 = *(undefined4 *)&pgVar2->field_0xc;
  pgVar8 = gs_parse_expr_comparison(parser);
  if (parser->error == false) {
    while( true ) {
      pgVar2 = (parser->tokens).data;
      iVar1 = parser->cur_token;
      bVar11 = pgVar2[iVar1].type != GS_TOKEN_CHAR;
      bVar12 = pgVar2[iVar1].field_3.c != '=';
      if (bVar12 || bVar11) break;
      if (iVar1 < (parser->tokens).length) {
        parser->cur_token = iVar1 + 1;
      }
      if (bVar12 || bVar11) {
        return pgVar8;
      }
      pgVar9 = gs_parse_expr_assignment(parser);
      if (parser->error != false) {
        return pgVar8;
      }
      pgVar10 = (gs_expr_t *)gs_parser_alloc(parser,0x40);
      pgVar10->type = GS_EXPR_ASSIGNMENT;
      (pgVar10->token).type = gVar4;
      (pgVar10->token).line = iVar5;
      (pgVar10->token).col = iVar6;
      *(undefined4 *)&(pgVar10->token).field_0xc = uVar7;
      (pgVar10->token).field_3 = aVar3;
      (pgVar10->field_2).assignment.left = pgVar8;
      (pgVar10->field_2).binary_op.left = pgVar9;
      pgVar8 = pgVar10;
    }
  }
  return pgVar8;
}

Assistant:

static gs_expr_t *gs_parse_expr_assignment(gs_parser_t *parser) {
    gs_token_t token = gs_peek(parser);
    gs_expr_t *expr = gs_parse_expr_comparison(parser);
    if (parser->error) goto cleanup;

    while (true) {
        if (gs_eat_char(parser, '=')) {
            gs_expr_t *right = gs_parse_expr_assignment(parser);
            if (parser->error) goto cleanup;

            expr = gs_expr_assignment_new(parser, token, expr, right);
        }
        else {
            break;
        }
    }

cleanup:
    return expr;
}